

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O2

void AlphaReplace_SSE2(uint32_t *src,int length,uint32_t color)

{
  uint *puVar1;
  uint32_t *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  
  lVar11 = 0;
  while (lVar11 + 8 <= (long)length) {
    puVar1 = src + lVar11;
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar3 = src + lVar11 + 4;
    uVar7 = *puVar3;
    uVar8 = puVar3[1];
    uVar9 = puVar3[2];
    uVar10 = puVar3[3];
    uVar12 = -(uint)(-0x7f000001 < (int)(*puVar1 ^ 0x80000000));
    uVar13 = -(uint)(-0x7f000001 < (int)(uVar4 ^ 0x80000000));
    uVar14 = -(uint)(-0x7f000001 < (int)(uVar5 ^ 0x80000000));
    uVar15 = -(uint)(-0x7f000001 < (int)(uVar6 ^ 0x80000000));
    uVar16 = -(uint)(-0x7f000001 < (int)(uVar7 ^ 0x80000000));
    uVar17 = -(uint)(-0x7f000001 < (int)(uVar8 ^ 0x80000000));
    uVar18 = -(uint)(-0x7f000001 < (int)(uVar9 ^ 0x80000000));
    uVar19 = -(uint)(-0x7f000001 < (int)(uVar10 ^ 0x80000000));
    puVar2 = src + lVar11;
    *puVar2 = ~uVar12 & color | *puVar1 & uVar12;
    puVar2[1] = ~uVar13 & color | uVar4 & uVar13;
    puVar2[2] = ~uVar14 & color | uVar5 & uVar14;
    puVar2[3] = ~uVar15 & color | uVar6 & uVar15;
    puVar2 = src + lVar11 + 4;
    *puVar2 = ~uVar16 & color | uVar7 & uVar16;
    puVar2[1] = ~uVar17 & color | uVar8 & uVar17;
    puVar2[2] = ~uVar18 & color | uVar9 & uVar18;
    puVar2[3] = ~uVar19 & color | uVar10 & uVar19;
    lVar11 = lVar11 + 8;
  }
  for (; lVar11 < length; lVar11 = lVar11 + 1) {
    if (src[lVar11] < 0x1000000) {
      src[lVar11] = color;
    }
  }
  return;
}

Assistant:

static void AlphaReplace_SSE2(uint32_t* src, int length, uint32_t color) {
  const __m128i m_color = _mm_set1_epi32((int)color);
  const __m128i zero = _mm_setzero_si128();
  int i = 0;
  for (; i + 8 <= length; i += 8) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(src + i + 0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(src + i + 4));
    const __m128i b0 = _mm_srai_epi32(a0, 24);
    const __m128i b1 = _mm_srai_epi32(a1, 24);
    const __m128i c0 = _mm_cmpeq_epi32(b0, zero);
    const __m128i c1 = _mm_cmpeq_epi32(b1, zero);
    const __m128i d0 = _mm_and_si128(c0, m_color);
    const __m128i d1 = _mm_and_si128(c1, m_color);
    const __m128i e0 = _mm_andnot_si128(c0, a0);
    const __m128i e1 = _mm_andnot_si128(c1, a1);
    _mm_storeu_si128((__m128i*)(src + i + 0), _mm_or_si128(d0, e0));
    _mm_storeu_si128((__m128i*)(src + i + 4), _mm_or_si128(d1, e1));
  }
  for (; i < length; ++i) if ((src[i] >> 24) == 0) src[i] = color;
}